

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Light.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseNode_Lighting_DirectionalLight(X3DImporter *this)

{
  FIReader *pFVar1;
  CX3DImporter_NodeElement *pParentElement;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  CX3DImporter_NodeElement_Light *this_00;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *this_01;
  string *psVar5;
  uint pAttrIdx;
  bool local_e9;
  CX3DImporter_NodeElement *ne;
  float local_dc;
  undefined4 local_d8;
  float local_d4;
  pointer local_d0;
  float local_c8;
  aiColor3D local_c0;
  string an;
  string use;
  string def;
  string local_50;
  
  def._M_dataplus._M_p = (pointer)&def.field_2;
  def._M_string_length = 0;
  pAttrIdx = 0;
  def.field_2._M_local_buf[0] = '\0';
  use._M_dataplus._M_p = (pointer)&use.field_2;
  use._M_string_length = 0;
  use.field_2._M_local_buf[0] = '\0';
  local_d0 = (pointer)0x0;
  local_c0.r = 1.0;
  local_c0.g = 1.0;
  ne = (CX3DImporter_NodeElement *)0x0;
  local_c0.b = 1.0;
  local_c8 = -1.0;
  uVar3 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  local_d4 = 0.0;
  local_e9 = true;
  local_dc = 1.0;
  local_d8 = 0;
  for (; uVar3 != pAttrIdx; pAttrIdx = pAttrIdx + 1) {
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar4 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar1,(ulong)pAttrIdx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&an,(char *)CONCAT44(extraout_var_00,iVar4),(allocator<char> *)&local_50);
    bVar2 = std::operator==(&an,"DEF");
    if (bVar2) {
      pFVar1 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                (pFVar1,(ulong)pAttrIdx);
      psVar5 = &def;
LAB_004de780:
      std::__cxx11::string::assign((char *)psVar5);
    }
    else {
      bVar2 = std::operator==(&an,"USE");
      if (bVar2) {
        pFVar1 = (this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
        (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                  (pFVar1,(ulong)pAttrIdx);
        psVar5 = &use;
        goto LAB_004de780;
      }
      bVar2 = std::operator==(&an,"bboxCenter");
      if (!bVar2) {
        bVar2 = std::operator==(&an,"bboxSize");
        if (!bVar2) {
          bVar2 = std::operator==(&an,"containerField");
          if (!bVar2) {
            bVar2 = std::operator==(&an,"ambientIntensity");
            if (bVar2) {
              local_d4 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
            }
            else {
              bVar2 = std::operator==(&an,"color");
              if (bVar2) {
                XML_ReadNode_GetAttrVal_AsCol3f(this,pAttrIdx,&local_c0);
              }
              else {
                bVar2 = std::operator==(&an,"direction");
                if (bVar2) {
                  XML_ReadNode_GetAttrVal_AsVec3f(this,pAttrIdx,(aiVector3D *)&local_d0);
                }
                else {
                  bVar2 = std::operator==(&an,"global");
                  if (bVar2) {
                    bVar2 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                    local_d8 = (undefined4)CONCAT71(extraout_var,bVar2);
                  }
                  else {
                    bVar2 = std::operator==(&an,"intensity");
                    if (bVar2) {
                      local_dc = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                    }
                    else {
                      bVar2 = std::operator==(&an,"on");
                      if (bVar2) {
                        local_e9 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                      }
                      else {
                        Throw_IncorrectAttr(this,&an);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&an);
  }
  if (use._M_string_length == 0) {
    if (local_e9 == false) goto LAB_004deab2;
    this_00 = (CX3DImporter_NodeElement_Light *)operator_new(0x98);
    CX3DImporter_NodeElement_Light::CX3DImporter_NodeElement_Light
              (this_00,ENET_DirectionalLight,this->NodeElement_Cur);
    ne = (CX3DImporter_NodeElement *)this_00;
    if (def._M_string_length == 0) {
      to_string<unsigned_long>(&local_50,(unsigned_long)this_00);
      std::operator+(&an,"DirectionalLight_",&local_50);
      std::__cxx11::string::operator=((string *)&ne->ID,(string *)&an);
      std::__cxx11::string::~string((string *)&an);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&(this_00->super_CX3DImporter_NodeElement).ID);
    }
    *(float *)&ne[1]._vptr_CX3DImporter_NodeElement = local_d4;
    *(undefined8 *)((long)&ne[1]._vptr_CX3DImporter_NodeElement + 4) = local_c0._0_8_;
    *(ai_real *)&ne[1].field_0xc = local_c0.b;
    ne[1].ID._M_dataplus._M_p = local_d0;
    *(float *)&ne[1].ID._M_string_length = local_c8;
    *(byte *)((long)&ne[1].ID._M_string_length + 4) = (byte)local_d8 & 1;
    *(float *)&ne[1].ID.field_2 = local_dc;
    ParseHelper_Group_Begin(this,false);
    std::__cxx11::string::_M_assign((string *)&this->NodeElement_Cur->ID);
    ParseHelper_Node_Exit(this);
    iVar4 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pParentElement = ne;
    if ((char)iVar4 == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&an,"DirectionalLight",(allocator<char> *)&local_50);
      ParseNode_Metadata(this,pParentElement,&an);
      std::__cxx11::string::~string((string *)&an);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,&ne);
    }
    this_01 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (def._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar2 = FindNodeElement(this,&use,ENET_DirectionalLight,&ne);
    if (!bVar2) {
      Throw_USE_NotFound(this,&use);
    }
    this_01 = &this->NodeElement_Cur->Child;
  }
  std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
  push_back(this_01,&ne);
LAB_004deab2:
  std::__cxx11::string::~string((string *)&use);
  std::__cxx11::string::~string((string *)&def);
  return;
}

Assistant:

void X3DImporter::ParseNode_Lighting_DirectionalLight()
{
    std::string def, use;
    float ambientIntensity = 0;
    aiColor3D color(1, 1, 1);
    aiVector3D direction(0, 0, -1);
    bool global = false;
    float intensity = 1;
    bool on = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ambientIntensity", ambientIntensity, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("color", color, XML_ReadNode_GetAttrVal_AsCol3f);
		MACRO_ATTRREAD_CHECK_REF("direction", direction, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_RET("global", global, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("intensity", intensity, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("on", on, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_DirectionalLight, ne);
	}
	else
	{
		if(on)
		{
			// create and if needed - define new geometry object.
			ne = new CX3DImporter_NodeElement_Light(CX3DImporter_NodeElement::ENET_DirectionalLight, NodeElement_Cur);
			if(!def.empty())
				ne->ID = def;
			else
				ne->ID = "DirectionalLight_" + to_string((size_t)ne);// make random name

			((CX3DImporter_NodeElement_Light*)ne)->AmbientIntensity = ambientIntensity;
			((CX3DImporter_NodeElement_Light*)ne)->Color = color;
			((CX3DImporter_NodeElement_Light*)ne)->Direction = direction;
			((CX3DImporter_NodeElement_Light*)ne)->Global = global;
			((CX3DImporter_NodeElement_Light*)ne)->Intensity = intensity;
			// Assimp want a node with name similar to a light. "Why? I don't no." )
			ParseHelper_Group_Begin(false);

			NodeElement_Cur->ID = ne->ID;// assign name to node and return to light element.
			ParseHelper_Node_Exit();
			// check for child nodes
			if(!mReader->isEmptyElement())
				ParseNode_Metadata(ne, "DirectionalLight");
			else
				NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

			NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
		}// if(on)
	}// if(!use.empty()) else
}